

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,TestContext *testCtx,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  DataType DVar5;
  float fVar6;
  Precision PVar7;
  DataType DVar8;
  DataType DVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ShaderEvalFunc evalFunc_00;
  byte bVar14;
  char *__s;
  int iVar15;
  OperatorShaderEvaluator *this_00;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  ShaderEvalFunc local_38;
  ShaderEvalFunc evalFunc_local;
  char *pcStack_28;
  bool isVertexCase_local;
  char *description_local;
  char *caseName_local;
  TestContext *testCtx_local;
  ShaderOperatorCase *this_local;
  
  local_38 = evalFunc;
  evalFunc_local._7_1_ = isVertexCase;
  pcStack_28 = description;
  description_local = caseName;
  caseName_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,caseName,&local_59);
  __s = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
  bVar14 = evalFunc_local._7_1_;
  this_00 = (OperatorShaderEvaluator *)operator_new(0x28);
  evalFunc_00 = local_38;
  fVar1 = spec->referenceScale;
  fVar2 = spec->referenceBias;
  iVar15 = glu::getDataTypeScalarSize(spec->output);
  OperatorShaderEvaluator::OperatorShaderEvaluator(this_00,evalFunc_00,fVar1,fVar2,iVar15);
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,&local_58,&local_90,(bool)(bVar14 & 1),
             (ShaderEvaluator *)this_00,(UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_016a8bc0;
  fVar10 = spec->resultScale;
  fVar11 = spec->resultBias;
  fVar12 = spec->referenceScale;
  fVar13 = spec->referenceBias;
  PVar7 = spec->precision;
  DVar8 = spec->output;
  iVar15 = spec->numInputs;
  DVar9 = spec->inputs[0].type;
  fVar3 = spec->inputs[0].rangeMin;
  fVar4 = spec->inputs[0].rangeMax;
  DVar5 = spec->inputs[1].type;
  fVar6 = spec->inputs[1].rangeMin;
  fVar1 = spec->inputs[2].rangeMin;
  fVar2 = spec->inputs[2].rangeMax;
  *(undefined8 *)&(this->m_spec).inputs[1].rangeMax = *(undefined8 *)&spec->inputs[1].rangeMax;
  (this->m_spec).inputs[2].rangeMin = fVar1;
  (this->m_spec).inputs[2].rangeMax = fVar2;
  (this->m_spec).inputs[0].rangeMin = fVar3;
  (this->m_spec).inputs[0].rangeMax = fVar4;
  (this->m_spec).inputs[1].type = DVar5;
  (this->m_spec).inputs[1].rangeMin = fVar6;
  (this->m_spec).precision = PVar7;
  (this->m_spec).output = DVar8;
  (this->m_spec).numInputs = iVar15;
  (this->m_spec).inputs[0].type = DVar9;
  (this->m_spec).resultScale = fVar10;
  (this->m_spec).resultBias = fVar11;
  (this->m_spec).referenceScale = fVar12;
  (this->m_spec).referenceBias = fVar13;
  std::__cxx11::string::string((string *)&this->m_shaderOp,(string *)shaderOp);
  setupShaderData(this);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (tcu::TestContext&		testCtx,
										const char*				caseName,
										const char*				description,
										const bool				isVertexCase,
										const ShaderEvalFunc	evalFunc,
										const std::string&		shaderOp,
										const ShaderDataSpec&	spec)
	: ShaderRenderCase	(testCtx,
						 caseName,
						 description,
						 isVertexCase,
						 new OperatorShaderEvaluator(evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output)),
						 DE_NULL,
						 DE_NULL)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
{
	setupShaderData();
}